

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O3

void flatbuffers::tests::ParseProtoTest(string *tests_data_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  string import_proto_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> proto_path;
  string proto_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_a8;
  string local_88;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar2 = (tests_data_path->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + tests_data_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_a8.field_2;
  pcVar2 = (tests_data_path->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + tests_data_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  bVar3 = LoadFile(local_a8._M_dataplus._M_p,false,&local_68);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"prototest/test.proto\").c_str(), false, &proto_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x123,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  pcVar2 = (tests_data_path->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + tests_data_path->_M_string_length);
  std::__cxx11::string::append((char *)local_48);
  bVar3 = LoadFile((char *)local_48[0],false,&local_a8);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"prototest/imported.proto\").c_str(), false, &import_proto_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x129,"");
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  proto_test(&local_88,&local_68);
  proto_test_union(&local_88,&local_68);
  proto_test_union_suffix(&local_88,&local_68);
  proto_test_include(&local_88,&local_68,&local_a8);
  proto_test_include_union(&local_88,&local_68,&local_a8);
  proto_test_id(&local_88,&local_68);
  proto_test_union_id(&local_88,&local_68);
  proto_test_union_suffix_id(&local_88,&local_68);
  proto_test_include_id(&local_88,&local_68,&local_a8);
  proto_test_include_union_id(&local_88,&local_68,&local_a8);
  ParseCorruptedProto(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParseProtoTest(const std::string &tests_data_path) {
  auto proto_path = tests_data_path + "prototest/";
  std::string proto_file;
  TEST_EQ(
      flatbuffers::LoadFile((tests_data_path + "prototest/test.proto").c_str(),
                            false, &proto_file),
      true);

  std::string import_proto_file;
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "prototest/imported.proto").c_str(), false,
              &import_proto_file),
          true);

  proto_test(proto_path, proto_file);
  proto_test_union(proto_path, proto_file);
  proto_test_union_suffix(proto_path, proto_file);
  proto_test_include(proto_path, proto_file, import_proto_file);
  proto_test_include_union(proto_path, proto_file, import_proto_file);

  proto_test_id(proto_path, proto_file);
  proto_test_union_id(proto_path, proto_file);
  proto_test_union_suffix_id(proto_path, proto_file);
  proto_test_include_id(proto_path, proto_file, import_proto_file);
  proto_test_include_union_id(proto_path, proto_file, import_proto_file);

  ParseCorruptedProto(proto_path);
}